

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  num_writer f;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int num_digits;
  size_type sVar8;
  string_view prefix;
  string groups;
  undefined7 uStack_5f;
  string local_40;
  
  grouping_impl<char>(&local_40,(locale_ref)(this->writer->locale_).locale_);
  if (local_40._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar1 = this->specs->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      uVar3 = this->abs_value;
      uVar6 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar7 = (uVar6 + 1) -
              (uint)(uVar3 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar6 * 4)
                    );
      num_digits = (int)local_40._M_string_length + iVar7;
      sVar8 = 0;
      iVar4 = iVar7;
      do {
        cVar2 = local_40._M_dataplus._M_p[sVar8];
        iVar5 = iVar4 - cVar2;
        if ((iVar5 == 0 || iVar4 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          num_digits = iVar7 + (int)sVar8;
          iVar5 = iVar4;
          if (local_40._M_string_length != sVar8) goto LAB_002a1567;
          break;
        }
        sVar8 = sVar8 + 1;
        iVar4 = iVar5;
      } while (local_40._M_string_length != sVar8);
      num_digits = (iVar5 + -1) / (int)local_40._M_dataplus._M_p[local_40._M_string_length - 1] +
                   num_digits;
LAB_002a1567:
      f._17_7_ = uStack_5f;
      f.sep = cVar1;
      f.size = num_digits;
      f.abs_value = uVar3;
      f.groups = &local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }